

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void calculate_path_table_size(vdd *vdd)

{
  int iVar1;
  isoent **ppiVar2;
  uint local_34;
  int len;
  int cnt;
  int i;
  isoent **ptbl;
  path_table *pt;
  int size;
  int depth;
  vdd *vdd_local;
  
  pt._0_4_ = 0;
  pt._4_4_ = 0;
  while ((pt._4_4_ < vdd->max_depth && (iVar1 = vdd->pathtbl[pt._4_4_].cnt, iVar1 != 0))) {
    ppiVar2 = vdd->pathtbl[pt._4_4_].sorted;
    for (len = 0; len < iVar1; len = len + 1) {
      if (ppiVar2[len]->identifier == (char *)0x0) {
        local_34 = 1;
      }
      else {
        local_34 = ppiVar2[len]->id_len;
      }
      if ((local_34 & 1) != 0) {
        local_34 = local_34 + 1;
      }
      pt._0_4_ = local_34 + 8 + (int)pt;
    }
    pt._4_4_ = pt._4_4_ + 1;
  }
  vdd->path_table_size = (int)pt;
  vdd->path_table_block = ((int)pt + 0xfff) / 0x1000 << 1;
  return;
}

Assistant:

static void
calculate_path_table_size(struct vdd *vdd)
{
	int depth, size;
	struct path_table *pt;

	pt = vdd->pathtbl;
	size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		struct isoent **ptbl;
		int i, cnt;

		if ((cnt = pt[depth].cnt) == 0)
			break;

		ptbl = pt[depth].sorted;
		for (i = 0; i < cnt; i++) {
			int len;

			if (ptbl[i]->identifier == NULL)
				len = 1; /* root directory */
			else
				len = ptbl[i]->id_len;
			if (len & 0x01)
				len++; /* Padding Field */
			size += 8 + len;
		}
	}
	vdd->path_table_size = size;
	vdd->path_table_block =
	    ((size + PATH_TABLE_BLOCK_SIZE -1) /
	    PATH_TABLE_BLOCK_SIZE) *
	    (PATH_TABLE_BLOCK_SIZE / LOGICAL_BLOCK_SIZE);
}